

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * common_params_get_system_info_abi_cxx11_(common_params *params)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  long in_RSI;
  string *in_RDI;
  ostringstream os;
  ostringstream local_188 [376];
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"system_info: n_threads = ");
  std::ostream::operator<<(poVar2,*(int *)(local_10 + 0x274));
  if (*(int *)(local_10 + 0x488) != -1) {
    poVar2 = std::operator<<((ostream *)local_188," (n_threads_batch = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(local_10 + 0x488));
    std::operator<<(poVar2,")");
  }
  poVar2 = std::operator<<((ostream *)local_188," / ");
  uVar1 = std::thread::hardware_concurrency();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2," | ");
  pcVar3 = (char *)llama_print_system_info();
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string common_params_get_system_info(const common_params & params) {
    std::ostringstream os;

    os << "system_info: n_threads = " << params.cpuparams.n_threads;
    if (params.cpuparams_batch.n_threads != -1) {
        os << " (n_threads_batch = " << params.cpuparams_batch.n_threads << ")";
    }
#if defined(_WIN32) && (_WIN32_WINNT >= 0x0601) && !defined(__MINGW64__) // windows 7 and later
    // TODO: windows + arm64 + mingw64
    DWORD logicalProcessorCount = GetActiveProcessorCount(ALL_PROCESSOR_GROUPS);
    os << " / " << logicalProcessorCount << " | " << llama_print_system_info();
#else
    os << " / " << std::thread::hardware_concurrency() << " | " << llama_print_system_info();
#endif

    return os.str();
}